

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.cpp
# Opt level: O0

ssize_t __thiscall Flasher::write(Flasher *this,int __fd,void *__buf,size_t __n)

{
  FlasherObserver *pFVar1;
  _func_int *p_Var2;
  unique_ptr<Flash,_std::default_delete<Flash>_> *puVar3;
  long lVar4;
  FILE *pFVar5;
  uint uVar6;
  int iVar7;
  pointer pFVar8;
  int *piVar9;
  undefined4 extraout_var;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  size_t __n_00;
  unsigned_long uVar13;
  undefined4 in_register_00000034;
  void *pvVar14;
  undefined1 *puStack_110;
  size_t local_108;
  void *local_100;
  size_t local_f8;
  void *local_f0;
  uint32_t local_e8;
  undefined1 local_e1;
  FileSizeError *local_e0;
  uint local_d8;
  uint local_d4;
  FileIoError *local_d0;
  FileIoError *local_c8;
  size_t local_c0;
  int local_b4;
  FileOpenError *local_b0;
  FileOpenError *local_a8;
  FlashOffsetError *local_a0;
  uint local_94;
  Flasher *local_90;
  uint local_84;
  ulong uStack_80;
  uint32_t pageOffset;
  unsigned_long __vla_expr1;
  ulong local_70;
  unsigned_long __vla_expr0;
  uint local_5c;
  uint local_58;
  uint32_t bufferSize;
  uint32_t offset;
  ulong local_48;
  size_t fbytes;
  long fsize;
  uint local_30;
  uint32_t numPages;
  uint32_t pageNum;
  uint32_t pageSize;
  FILE *infile;
  char *pcStack_18;
  uint32_t foffset_local;
  char *filename_local;
  Flasher *this_local;
  
  pcStack_18 = (char *)CONCAT44(in_register_00000034,__fd);
  infile._4_4_ = (uint)__buf;
  puStack_110 = (undefined1 *)0x111b7a;
  local_90 = this;
  filename_local = (char *)this;
  pFVar8 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
  puStack_110 = (undefined1 *)0x111b83;
  numPages = (*pFVar8->_vptr_Flash[3])();
  local_30 = 0;
  if (infile._4_4_ % numPages == 0) {
    local_94 = infile._4_4_;
    puStack_110 = (undefined1 *)0x111bb3;
    pFVar8 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(local_90->_flash);
    puStack_110 = (undefined1 *)0x111bbc;
    uVar6 = (*pFVar8->_vptr_Flash[6])();
    if (local_94 < uVar6) {
      puStack_110 = (undefined1 *)0x111c2d;
      _pageNum = fopen(pcStack_18,"rb");
      if (_pageNum == (FILE *)0x0) {
        puStack_110 = (undefined1 *)0x111c42;
        local_b0 = (FileOpenError *)__cxa_allocate_exception(0x10);
        puStack_110 = (undefined1 *)0x111c55;
        local_a8 = local_b0;
        piVar9 = __errno_location();
        puStack_110 = (undefined1 *)0x111c63;
        FileOpenError::FileOpenError(local_a8,*piVar9);
        puStack_110 = &LAB_00111c7f;
        __cxa_throw(local_b0,&FileOpenError::typeinfo,FileOpenError::~FileOpenError);
      }
      puStack_110 = (undefined1 *)0x111cae;
      local_b4 = fseek(_pageNum,0,2);
      if (local_b4 == 0) {
        puStack_110 = (undefined1 *)0x111cca;
        local_c0 = ftell(_pageNum);
        fbytes = local_c0;
        if (-1 < (long)local_c0) {
          puStack_110 = (undefined1 *)0x111d67;
          rewind(_pageNum);
          local_d8 = (uint)((long)((fbytes - 1) + (ulong)numPages) / (long)(ulong)numPages);
          puStack_110 = (undefined1 *)0x111d99;
          fsize._4_4_ = local_d8;
          pFVar8 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(local_90->_flash)
          ;
          puStack_110 = (undefined1 *)0x111da5;
          local_d4 = (*pFVar8->_vptr_Flash[4])();
          if (local_d4 < local_d8) {
            puStack_110 = (undefined1 *)0x111dc7;
            local_e0 = (FileSizeError *)__cxa_allocate_exception(8);
            puStack_110 = (undefined1 *)0x111dd9;
            FileSizeError::FileSizeError(local_e0);
            puStack_110 = &LAB_00111df5;
            __cxa_throw(local_e0,&FileSizeError::typeinfo,FileSizeError::~FileSizeError);
          }
          puStack_110 = (undefined1 *)0x111e55;
          (*local_90->_observer->_vptr_FlasherObserver[2])
                    (local_90->_observer,"Write %ld bytes to flash (%u pages)\n",fbytes,
                     (ulong)fsize._4_4_);
          puStack_110 = (undefined1 *)0x111e67;
          local_e1 = Samba::canWriteBuffer(local_90->_samba);
          if ((bool)local_e1) {
            local_58 = 0;
            puStack_110 = (undefined1 *)0x111e95;
            local_e8 = Samba::writeBufferSize(local_90->_samba);
            local_70 = (ulong)local_e8;
            lVar4 = -(local_70 + 0xf & 0xfffffffffffffff0);
            local_f0 = (void *)((long)&local_108 + lVar4);
            __vla_expr0 = (unsigned_long)&local_108;
            local_5c = local_e8;
            while( true ) {
              pFVar5 = _pageNum;
              pvVar14 = local_f0;
              uVar11 = (ulong)local_5c;
              *(undefined8 *)((long)&puStack_110 + lVar4) = 0x111ee9;
              local_f8 = fread(pvVar14,1,uVar11,pFVar5);
              if (local_f8 == 0) break;
              pFVar1 = local_90->_observer;
              uVar10 = (ulong)numPages;
              uVar11 = (ulong)local_58;
              uVar12 = (ulong)fsize._4_4_;
              p_Var2 = pFVar1->_vptr_FlasherObserver[3];
              local_48 = local_f8;
              *(undefined8 *)((long)&puStack_110 + lVar4) = 0x111f2a;
              (*p_Var2)(pFVar1,uVar11 / uVar10,uVar12);
              if (local_48 < local_5c) {
                pvVar14 = (void *)((long)local_f0 + local_48);
                __n_00 = local_5c - local_48;
                *(undefined8 *)((long)&puStack_110 + lVar4) = 0x111f53;
                memset(pvVar14,0,__n_00);
                local_48 = (((local_48 + numPages) - 1) / (ulong)numPages) * (ulong)numPages;
              }
              puVar3 = local_90->_flash;
              *(undefined8 *)((long)&puStack_110 + lVar4) = 0x111f84;
              pFVar8 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(puVar3);
              pvVar14 = local_f0;
              uVar11 = local_48 & 0xffff;
              p_Var2 = pFVar8->_vptr_Flash[0x1b];
              *(undefined8 *)((long)&puStack_110 + lVar4) = 0x111f9e;
              (*p_Var2)(pFVar8,pvVar14,uVar11);
              puVar3 = local_90->_flash;
              *(undefined8 *)((long)&puStack_110 + lVar4) = 0x111fb0;
              pFVar8 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(puVar3);
              uVar6 = infile._4_4_ + local_58;
              uVar11 = local_48 & 0xffffffff;
              p_Var2 = pFVar8->_vptr_Flash[0x1a];
              *(undefined8 *)((long)&puStack_110 + lVar4) = 0x111fca;
              (*p_Var2)(pFVar8,(ulong)uVar6,uVar11);
              local_58 = local_58 + (int)local_48;
            }
            local_f8 = 0;
            local_48 = 0;
            uVar13 = __vla_expr0;
          }
          else {
            uStack_80 = (ulong)numPages;
            lVar4 = -(uStack_80 + 0xf & 0xfffffffffffffff0);
            local_100 = (void *)((long)&local_108 + lVar4);
            local_84 = infile._4_4_ / numPages;
            __vla_expr1 = (unsigned_long)&local_108;
            while( true ) {
              pFVar5 = _pageNum;
              pvVar14 = local_100;
              uVar11 = (ulong)numPages;
              *(undefined8 *)((long)&puStack_110 + lVar4) = 0x112038;
              local_108 = fread(pvVar14,1,uVar11,pFVar5);
              uVar13 = __vla_expr1;
              local_48 = local_108;
              if (local_108 == 0) break;
              pFVar1 = local_90->_observer;
              uVar10 = (ulong)local_30;
              uVar11 = (ulong)fsize._4_4_;
              p_Var2 = pFVar1->_vptr_FlasherObserver[3];
              *(undefined8 *)((long)&puStack_110 + lVar4) = 0x112070;
              (*p_Var2)(pFVar1,uVar10,uVar11);
              puVar3 = local_90->_flash;
              *(undefined8 *)((long)&puStack_110 + lVar4) = 0x112082;
              pFVar8 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(puVar3);
              pvVar14 = local_100;
              uVar11 = local_48 & 0xffff;
              p_Var2 = pFVar8->_vptr_Flash[0x1b];
              *(undefined8 *)((long)&puStack_110 + lVar4) = 0x11209c;
              (*p_Var2)(pFVar8,pvVar14,uVar11);
              puVar3 = local_90->_flash;
              *(undefined8 *)((long)&puStack_110 + lVar4) = 0x1120ae;
              pFVar8 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(puVar3);
              uVar6 = local_84 + local_30;
              p_Var2 = pFVar8->_vptr_Flash[0x18];
              *(undefined8 *)((long)&puStack_110 + lVar4) = 0x1120c5;
              (*p_Var2)(pFVar8,(ulong)uVar6);
              local_30 = local_30 + 1;
              uVar13 = __vla_expr1;
              if ((local_30 == fsize._4_4_) || (local_48 != numPages)) break;
            }
          }
          *(undefined8 *)(uVar13 - 8) = 0x112112;
          fclose(_pageNum);
          pFVar1 = local_90->_observer;
          p_Var2 = pFVar1->_vptr_FlasherObserver[3];
          *(undefined8 *)(uVar13 - 8) = 0x112129;
          iVar7 = (*p_Var2)(pFVar1,(ulong)fsize._4_4_,(ulong)fsize._4_4_);
          return CONCAT44(extraout_var,iVar7);
        }
      }
      puStack_110 = (undefined1 *)0x111cee;
      local_d0 = (FileIoError *)__cxa_allocate_exception(0x10);
      puStack_110 = (undefined1 *)0x111d01;
      local_c8 = local_d0;
      piVar9 = __errno_location();
      puStack_110 = (undefined1 *)0x111d0f;
      FileIoError::FileIoError(local_c8,*piVar9);
      puStack_110 = &LAB_00111d2b;
      __cxa_throw(local_d0,&FileIoError::typeinfo,FileIoError::~FileIoError);
    }
  }
  puStack_110 = (undefined1 *)0x111bd2;
  local_a0 = (FlashOffsetError *)__cxa_allocate_exception(8);
  puStack_110 = (undefined1 *)0x111be4;
  FlashOffsetError::FlashOffsetError(local_a0);
  puStack_110 = &LAB_00111c00;
  __cxa_throw(local_a0,&FlashOffsetError::typeinfo,FlashOffsetError::~FlashOffsetError);
}

Assistant:

void
Flasher::write(const char* filename, uint32_t foffset)
{
    FILE* infile;
    uint32_t pageSize = _flash->pageSize();
    uint32_t pageNum = 0;
    uint32_t numPages;
    long fsize;
    size_t fbytes;

    if (foffset % pageSize != 0 || foffset >= _flash->totalSize())
        throw FlashOffsetError();
    
    infile = fopen(filename, "rb");
    if (!infile)
        throw FileOpenError(errno);

    try
    {
        if (fseek(infile, 0, SEEK_END) != 0 || (fsize = ftell(infile)) < 0)
            throw FileIoError(errno);
        
        rewind(infile);

        numPages = (fsize + pageSize - 1) / pageSize;
        if (numPages > _flash->numPages())
            throw FileSizeError();

        _observer.onStatus("Write %ld bytes to flash (%u pages)\n", fsize, numPages);
       
      
        if (_samba.canWriteBuffer())
        {
           
            uint32_t offset = 0;
            uint32_t bufferSize = _samba.writeBufferSize();
            uint8_t buffer[bufferSize];
            
            while ((fbytes = fread(buffer, 1, bufferSize, infile)) > 0)
            {
                _observer.onProgress(offset / pageSize, numPages);
                
                if (fbytes < bufferSize)
                {
                    memset(buffer + fbytes, 0, bufferSize - fbytes);
                    fbytes = (fbytes + pageSize - 1) / pageSize * pageSize;
                }
                
                _flash->loadBuffer(buffer, fbytes);
                _flash->writeBuffer(foffset + offset, fbytes);
                offset += fbytes;                
            }

        }
        else
        {
            uint8_t buffer[pageSize];
            uint32_t pageOffset = foffset / pageSize;

            while ((fbytes = fread(buffer, 1, pageSize, infile)) > 0)
            {
                _observer.onProgress(pageNum, numPages);

                _flash->loadBuffer(buffer, fbytes);
                _flash->writePage(pageOffset + pageNum);

                pageNum++;
                if (pageNum == numPages || fbytes != pageSize)
                    break;
            }

        }
    }
    catch(...)
    {
        fclose(infile);
        throw;
    }
    
    fclose(infile);
    _observer.onProgress(numPages, numPages);
}